

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void hmac_drbg_update(cf_hmac_drbg *ctx,void *in1,size_t nin1,void *in2,size_t nin2,void *in3,
                     size_t nin3)

{
  undefined1 local_35a;
  undefined1 local_359;
  uint8_t local_358 [6];
  uint8_t one;
  uint8_t zero;
  uint8_t new_key [64];
  cf_chash *H;
  cf_hmac_ctx local;
  void *in3_local;
  size_t nin2_local;
  void *in2_local;
  size_t nin1_local;
  void *in1_local;
  cf_hmac_drbg *ctx_local;
  
  new_key._56_8_ = (ctx->hmac).hash;
  local_359 = 0;
  local.outer._352_8_ = in3;
  memcpy(&H,&ctx->hmac,0x2d8);
  cf_hmac_update((cf_hmac_ctx *)&H,ctx,*(size_t *)new_key._56_8_);
  cf_hmac_update((cf_hmac_ctx *)&H,&local_359,1);
  cf_hmac_update((cf_hmac_ctx *)&H,in1,nin1);
  cf_hmac_update((cf_hmac_ctx *)&H,in2,nin2);
  cf_hmac_update((cf_hmac_ctx *)&H,(void *)local.outer._352_8_,nin3);
  cf_hmac_finish((cf_hmac_ctx *)&H,local_358);
  cf_hmac_init(&ctx->hmac,(cf_chash *)new_key._56_8_,local_358,*(size_t *)new_key._56_8_);
  mem_clean(local_358,0x40);
  memcpy(&H,&ctx->hmac,0x2d8);
  cf_hmac_update((cf_hmac_ctx *)&H,ctx,*(size_t *)new_key._56_8_);
  cf_hmac_finish((cf_hmac_ctx *)&H,ctx->V);
  if (((nin1 != 0) || (nin2 != 0)) || (nin3 != 0)) {
    local_35a = 1;
    memcpy(&H,&ctx->hmac,0x2d8);
    cf_hmac_update((cf_hmac_ctx *)&H,ctx,*(size_t *)new_key._56_8_);
    cf_hmac_update((cf_hmac_ctx *)&H,&local_35a,1);
    cf_hmac_update((cf_hmac_ctx *)&H,in1,nin1);
    cf_hmac_update((cf_hmac_ctx *)&H,in2,nin2);
    cf_hmac_update((cf_hmac_ctx *)&H,(void *)local.outer._352_8_,nin3);
    cf_hmac_finish((cf_hmac_ctx *)&H,local_358);
    cf_hmac_init(&ctx->hmac,(cf_chash *)new_key._56_8_,local_358,*(size_t *)new_key._56_8_);
    mem_clean(local_358,0x40);
    memcpy(&H,&ctx->hmac,0x2d8);
    cf_hmac_update((cf_hmac_ctx *)&H,ctx,*(size_t *)new_key._56_8_);
    cf_hmac_finish((cf_hmac_ctx *)&H,ctx->V);
  }
  return;
}

Assistant:

static void hmac_drbg_update(cf_hmac_drbg *ctx,
                             const void *in1, size_t nin1,
                             const void *in2, size_t nin2,
                             const void *in3, size_t nin3)
{
  cf_hmac_ctx local;
  const cf_chash *H = ctx->hmac.hash;
  uint8_t new_key[CF_MAXHASH];
  uint8_t zero = 0;

  /* 1. K = HMAC(K, V || 0x00 || provided_data) */
  local = ctx->hmac;
  cf_hmac_update(&local, ctx->V, H->hashsz);
  cf_hmac_update(&local, &zero, sizeof zero);
  cf_hmac_update(&local, in1, nin1);
  cf_hmac_update(&local, in2, nin2);
  cf_hmac_update(&local, in3, nin3);
  cf_hmac_finish(&local, new_key);
  cf_hmac_init(&ctx->hmac, H, new_key, H->hashsz);
  mem_clean(new_key, sizeof new_key);

  /* 2. V = HMAC(K, V) */
  local = ctx->hmac;
  cf_hmac_update(&local, ctx->V, H->hashsz);
  cf_hmac_finish(&local, ctx->V);

  /* 3. if (provided_data = null) then return K and V */
  if (nin1 == 0 && nin2 == 0 && nin3 == 0)
    return;

  /* 4. K = HMAC(K, V || 0x01 || provided_data) */
  uint8_t one = 1;
  local = ctx->hmac;
  cf_hmac_update(&local, ctx->V, H->hashsz);
  cf_hmac_update(&local, &one, sizeof one);
  cf_hmac_update(&local, in1, nin1);
  cf_hmac_update(&local, in2, nin2);
  cf_hmac_update(&local, in3, nin3);
  cf_hmac_finish(&local, new_key);
  cf_hmac_init(&ctx->hmac, H, new_key, H->hashsz);
  mem_clean(new_key, sizeof new_key);

  /* 5. V = HMAC(K, V) */
  local = ctx->hmac;
  cf_hmac_update(&local, ctx->V, H->hashsz);
  cf_hmac_finish(&local, ctx->V);
}